

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
::~vector(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
          *this)

{
  memory_resource *pmVar1;
  size_t sVar2;
  bool *pbVar3;
  
  sVar2 = this->nStored;
  if (sVar2 != 0) {
    pbVar3 = &this->ptr->set;
    do {
      if (*pbVar3 == true) {
        *pbVar3 = false;
      }
      pbVar3 = pbVar3 + 0x18;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  this->nStored = 0;
  if (this->ptr != (optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *)0x0) {
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0x18,8);
  }
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }